

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O2

char * crn_get_file_type_ext(crn_file_type file_type)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = "?";
  if (file_type == cCRNFileTypeCRN) {
    pcVar2 = "crn";
  }
  pcVar1 = "dds";
  if (file_type != cCRNFileTypeDDS) {
    pcVar1 = pcVar2;
  }
  return pcVar1;
}

Assistant:

const char* crn_get_file_type_ext(crn_file_type file_type)
{
    switch (file_type)
    {
    case cCRNFileTypeDDS:
        return "dds";
    case cCRNFileTypeCRN:
        return "crn";
    default:
        break;
    }
    return "?";
}